

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

int32_t paramInteger(USystemParams *param,char *target,int32_t targetCapacity,UErrorCode *status)

{
  char cVar1;
  int32_t iVar2;
  int32_t iStack_8;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (param->paramStr != (char *)0x0) {
    cVar1 = *param->paramStr;
    if (cVar1 == 'b') {
      iVar2 = param->paramInt;
      iStack_8 = 2;
      goto LAB_001ecc57;
    }
    if (cVar1 == 'x') {
      iVar2 = param->paramInt;
      iStack_8 = 0x10;
      goto LAB_001ecc57;
    }
    if (cVar1 == 'o') {
      iVar2 = param->paramInt;
      iStack_8 = 8;
      goto LAB_001ecc57;
    }
    if (cVar1 != 'd') {
      *status = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    }
  }
  iVar2 = param->paramInt;
  iStack_8 = 10;
LAB_001ecc57:
  iVar2 = integerToStringBuffer(target,targetCapacity,iVar2,iStack_8,status);
  return iVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }